

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containsmulti_benchmark.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  uint uVar2;
  char *pcVar3;
  void *pvVar4;
  size_t __nmemb;
  uint32_t uVar5;
  roaring_bitmap_t *prVar6;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  size_t *psVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  size_t sStack_1a0;
  size_t local_198;
  size_t *local_190;
  size_t local_188;
  size_t *local_180;
  uint local_174;
  long local_170 [3];
  size_t i_2;
  timespec ts_7;
  timespec ts_6;
  unsigned_long __vla_expr5;
  int local_124;
  undefined1 auStack_120 [4];
  int p_3;
  timespec ts_5;
  timespec ts_4;
  unsigned_long __vla_expr4;
  int local_ec;
  ulong uStack_e8;
  int p_2;
  size_t i_1;
  timespec ts_3;
  timespec ts_2;
  unsigned_long __vla_expr3;
  int local_ac;
  undefined1 auStack_a8 [4];
  int p_1;
  timespec ts_1;
  timespec ts;
  unsigned_long __vla_expr2;
  int local_74;
  int p;
  uint64_t cycles_final;
  uint64_t cycles_start;
  int num_passes;
  uint32_t *t_values;
  size_t t_count;
  int i;
  roaring_bitmap_t *bm;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  size_t fields;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    sStack_1a0 = 0x101404;
    printf("Usage: %s <comma_separated_integers_file> ...\n",*argv);
    sStack_1a0 = 0x101419;
    printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",*argv);
    argv_local._4_4_ = 1;
  }
  else {
    local_170[0] = (long)&local_198 - ((ulong)(uint)argc * 8 + 0xf & 0xfffffffffffffff0);
    lVar9 = local_170[0] - ((ulong)(uint)argc * 8 + 0xf & 0xfffffffffffffff0);
    local_170[1] = lVar9;
    *(undefined8 *)(lVar9 + -8) = 0x101482;
    prVar6 = roaring_bitmap_create();
    if (argc < 2) {
      *(undefined8 *)(lVar9 + -8) = 0x10155a;
      printf("Data:\n");
      *(undefined8 *)(lVar9 + -8) = 0x101563;
      uVar7 = roaring_bitmap_get_cardinality(*(roaring_bitmap_t **)(lVar9 + 0x18));
      *(undefined8 *)(lVar9 + -8) = 0x101574;
      printf("  cardinality: %lu\n",uVar7);
      uVar2 = (prVar6->high_low_container).size;
      *(undefined8 *)(lVar9 + -8) = 0x101588;
      printf("  buckets: %d\n",(ulong)uVar2);
      *(undefined8 *)(lVar9 + -8) = 0x101591;
      uVar5 = roaring_bitmap_minimum(*(roaring_bitmap_t **)(lVar9 + 0x10));
      local_174 = uVar5 >> 0x10;
      *(undefined8 *)(lVar9 + -8) = 0x1015a3;
      uVar5 = roaring_bitmap_maximum(*(roaring_bitmap_t **)(lVar9 + 0x10));
      uVar13 = (ulong)local_174;
      *(undefined8 *)(lVar9 + -8) = 0x1015bc;
      printf("  range: %u-%u\n",uVar13,(ulong)(uVar5 >> 0x10));
      *(undefined8 *)(lVar9 + -8) = 0x1015d6;
      printf("Cycles/element: %d\n",10);
      *(undefined8 *)(lVar9 + -8) = 0x1015e4;
      printf("                          roaring_bitmap_contains:");
      for (local_74 = 0; local_74 < 10; local_74 = local_74 + 1) {
        psVar10 = (size_t *)
                  (lVar9 - (*(long *)(local_170[1] + (long)local_74 * 8) + 0xfU & 0xfffffffffffffff0
                           ));
        local_180 = psVar10;
        psVar10[-1] = 0x10163b;
        clock_gettime(3,(timespec *)&ts_1.tv_nsec);
        lVar8 = ts_1.tv_nsec * 1000000000;
        psVar10[-1] = 0x101681;
        contains_multi_via_contains
                  ((roaring_bitmap_t *)psVar10[3],(uint32_t *)psVar10[2],(_Bool *)psVar10[1],
                   *psVar10);
        psVar10[-1] = 0x101692;
        clock_gettime(3,(timespec *)auStack_a8);
        lVar8 = (_auStack_a8 * 1000000000 + ts_1.tv_sec) - (lVar8 + ts.tv_sec);
        auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = 0x45300000;
        uVar1 = *(undefined8 *)(local_170[1] + (long)local_74 * 8);
        auVar18._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar18._0_8_ = uVar1;
        auVar18._12_4_ = 0x45300000;
        psVar10[-1] = 0x101711;
        printf(" %10f",((auVar14._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                       ((auVar18._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
      }
      *(undefined8 *)(lVar9 + -8) = 0x101734;
      printf("\n");
      *(undefined8 *)(lVar9 + -8) = 0x101742;
      printf("                     roaring_bitmap_contains_bulk:");
      for (local_ac = 0; local_ac < 10; local_ac = local_ac + 1) {
        lVar11 = lVar9 - (*(long *)(local_170[1] + (long)local_ac * 8) + 0xfU & 0xfffffffffffffff0);
        local_188 = lVar11;
        *(undefined8 *)(lVar11 + -8) = 0x1017a8;
        clock_gettime(3,(timespec *)&ts_3.tv_nsec);
        lVar8 = ts_3.tv_nsec * 1000000000;
        *(undefined8 *)(lVar11 + -8) = 0x1017f4;
        contains_multi_bulk(*(roaring_bitmap_t **)(lVar11 + 0x28),*(uint32_t **)(lVar11 + 0x20),
                            *(_Bool **)(lVar11 + 0x18),*(size_t *)(lVar11 + 0x10));
        *(undefined8 *)(lVar11 + -8) = 0x101805;
        clock_gettime(3,(timespec *)&i_1);
        lVar8 = (i_1 * 1000000000 + ts_3.tv_sec) - (lVar8 + ts_2.tv_sec);
        auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar15._0_8_ = lVar8;
        auVar15._12_4_ = 0x45300000;
        uVar1 = *(undefined8 *)(local_170[1] + (long)local_ac * 8);
        auVar19._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar19._0_8_ = uVar1;
        auVar19._12_4_ = 0x45300000;
        *(undefined8 *)(lVar11 + -8) = 0x101887;
        printf(" %10f",((auVar15._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                       ((auVar19._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
      }
      *(undefined8 *)(lVar9 + -8) = 0x1018b3;
      printf("\n");
      for (uStack_e8 = 0; uStack_e8 < (ulong)(long)(argc + -1); uStack_e8 = uStack_e8 + 1) {
        pvVar4 = *(void **)(local_170[0] + uStack_e8 * 8);
        __nmemb = *(size_t *)(local_170[1] + uStack_e8 * 8);
        *(undefined8 *)(lVar9 + -8) = 0x101900;
        qsort(pvVar4,__nmemb,4,compare_uint32);
      }
      *(undefined8 *)(lVar9 + -8) = 0x101922;
      printf("        roaring_bitmap_contains with sorted input:");
      for (local_ec = 0; local_ec < 10; local_ec = local_ec + 1) {
        psVar10 = (size_t *)
                  (lVar9 - (*(long *)(local_170[1] + (long)local_ec * 8) + 0xfU & 0xfffffffffffffff0
                           ));
        local_190 = psVar10;
        psVar10[-1] = 0x101988;
        clock_gettime(3,(timespec *)&ts_5.tv_nsec);
        lVar8 = ts_5.tv_nsec * 1000000000;
        psVar10[-1] = 0x1019d4;
        contains_multi_via_contains
                  ((roaring_bitmap_t *)psVar10[3],(uint32_t *)psVar10[2],(_Bool *)psVar10[1],
                   *psVar10);
        psVar10[-1] = 0x1019e5;
        clock_gettime(3,(timespec *)auStack_120);
        lVar8 = (_auStack_120 * 1000000000 + ts_5.tv_sec) - (lVar8 + ts_4.tv_sec);
        auVar16._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar16._0_8_ = lVar8;
        auVar16._12_4_ = 0x45300000;
        uVar1 = *(undefined8 *)(local_170[1] + (long)local_ec * 8);
        auVar20._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar20._0_8_ = uVar1;
        auVar20._12_4_ = 0x45300000;
        psVar10[-1] = 0x101a67;
        printf(" %10f",((auVar16._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                       ((auVar20._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
      }
      *(undefined8 *)(lVar9 + -8) = 0x101a93;
      printf("\n");
      *(undefined8 *)(lVar9 + -8) = 0x101aa1;
      printf("   roaring_bitmap_contains_bulk with sorted input:");
      for (local_124 = 0; local_124 < 10; local_124 = local_124 + 1) {
        sVar12 = lVar9 - (*(long *)(local_170[1] + (long)local_124 * 8) + 0xfU & 0xfffffffffffffff0)
        ;
        local_198 = sVar12;
        *(undefined8 *)(sVar12 - 8) = 0x101b07;
        clock_gettime(3,(timespec *)&ts_7.tv_nsec);
        lVar8 = ts_7.tv_nsec * 1000000000;
        *(undefined8 *)(sVar12 - 8) = 0x101b53;
        contains_multi_bulk(*(roaring_bitmap_t **)(sVar12 + 0x28),*(uint32_t **)(sVar12 + 0x20),
                            *(_Bool **)(sVar12 + 0x18),*(size_t *)(sVar12 + 0x10));
        *(undefined8 *)(sVar12 - 8) = 0x101b64;
        clock_gettime(3,(timespec *)&i_2);
        lVar8 = (i_2 * 1000000000 + ts_7.tv_sec) - (lVar8 + ts_6.tv_sec);
        auVar17._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar17._0_8_ = lVar8;
        auVar17._12_4_ = 0x45300000;
        uVar1 = *(undefined8 *)(local_170[1] + (long)local_124 * 8);
        auVar21._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar21._0_8_ = uVar1;
        auVar21._12_4_ = 0x45300000;
        *(undefined8 *)(sVar12 - 8) = 0x101be6;
        printf(" %10f",((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                       ((auVar21._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
      }
      *(undefined8 *)(lVar9 + -8) = 0x101c12;
      printf("\n");
      *(undefined8 *)(lVar9 + -8) = 0x101c1b;
      roaring_bitmap_free(*(roaring_bitmap_t **)(lVar9 + -8));
      for (local_170[2] = 0; (ulong)local_170[2] < (ulong)(long)(argc + -1);
          local_170[2] = local_170[2] + 1) {
        pvVar4 = *(void **)(local_170[0] + local_170[2] * 8);
        *(undefined8 *)(lVar9 + -8) = 0x101c4a;
        free(pvVar4);
      }
      argv_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)(lVar9 + -8) = 0x1014b6;
      read_integer_file(*(char **)(lVar9 + 0x40),*(size_t **)(lVar9 + 0x38));
      pcVar3 = argv[1];
      *(undefined8 *)(lVar9 + -8) = 0x1014db;
      printf("No integers found in %s\n",pcVar3);
      argv_local._4_4_ = 1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    (void)&read_all_integer_files;  // suppress unused warning

    if (argc < 2) {
        printf("Usage: %s <comma_separated_integers_file> ...\n", argv[0]);
        printf("Example: %s ~/CRoaring/benchmarks/realdata/weather_sept_85/*\n",
               argv[0]);
        return 1;
    }

    size_t fields = argc - 1;
    uint32_t* values[argc];
    size_t count[argc];

    roaring_bitmap_t* bm = roaring_bitmap_create();
    for (int i = 1; i < argc; i++) {
        size_t t_count = 0;
        uint32_t* t_values = read_integer_file(argv[i], &t_count);
        if (t_count == 0) {
            printf("No integers found in %s\n", argv[i]);
            return 1;
        }
        roaring_bitmap_add_many(bm, t_count, t_values);

        shuffle_uint32(t_values, t_count);

        values[i - 1] = t_values;
        count[i - 1] = t_count;
    }
    // roaring_bitmap_run_optimize(bm);

    printf("Data:\n");
    printf("  cardinality: %" PRIu64 "\n", roaring_bitmap_get_cardinality(bm));
    printf("  buckets: %d\n", (int)bm->high_low_container.size);
    printf("  range: %" PRIu32 "-%" PRIu32 "\n",
           roaring_bitmap_minimum(bm) >> 16, roaring_bitmap_maximum(bm) >> 16);

    const int num_passes = 10;
    printf("Cycles/element: %d\n", num_passes);
    uint64_t cycles_start, cycles_final;

    printf("                          roaring_bitmap_contains:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("                     roaring_bitmap_contains_bulk:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    // sort input array
    for (size_t i = 0; i < fields; ++i) {
        qsort(values[i], count[i], sizeof(uint32_t), compare_uint32);
    }

    printf("        roaring_bitmap_contains with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_via_contains(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    printf("   roaring_bitmap_contains_bulk with sorted input:");
    for (int p = 0; p < num_passes; p++) {
        bool result[count[p]];
        RDTSC_START(cycles_start);
        contains_multi_bulk(bm, values[p], result, count[p]);
        RDTSC_FINAL(cycles_final);
        printf(" %10f", (cycles_final - cycles_start) * 1.0 / count[p]);
    }
    printf("\n");

    roaring_bitmap_free(bm);
    for (size_t i = 0; i < fields; ++i) {
        free(values[i]);
    }
    return 0;
}